

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

QString * __thiscall QCss::Symbol::lexem(QString *__return_storage_ptr__,Symbol *this)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  Data *pDVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar6 = (long)this->len;
  if (0 < lVar6) {
    pDVar3 = (__return_storage_ptr__->d).d;
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar3->super_QArrayData).alloc -
        ((long)((long)(__return_storage_ptr__->d).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar6)) {
      lVar4 = (__return_storage_ptr__->d).size;
      if (lVar6 < lVar4) {
        lVar6 = lVar4;
      }
      QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar6);
    }
    pDVar3 = (__return_storage_ptr__->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  iVar5 = this->len;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      cVar2 = (this->text).d.ptr[this->start + iVar7];
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      iVar7 = iVar7 + (uint)(iVar7 < iVar5 + -1 && cVar2 == L'\\') + 1;
      iVar5 = this->len;
    } while (iVar7 < iVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

QString Symbol::lexem() const
{
    QString result;
    if (len > 0)
        result.reserve(len);
    for (int i = 0; i < len; ++i) {
        if (text.at(start + i) == u'\\' && i < len - 1)
            ++i;
        result += text.at(start + i);
    }
    return result;
}